

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int HashmapIsIntKey(SyBlob *pKey)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *zEnd;
  char *zIn;
  SyBlob *pKey_local;
  
  zEnd = (char *)pKey->pBlob;
  pcVar1 = zEnd + pKey->nByte;
  if (((int)pcVar1 - (int)zEnd < 2) || (*zEnd != '0')) {
    if (((*zEnd == '-') || (*zEnd == '+')) && (zEnd + 1 < pcVar1)) {
      zEnd = zEnd + 1;
    }
    for (; zEnd < pcVar1; zEnd = zEnd + 1) {
      if ((0xbf < (byte)*zEnd) || (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*zEnd] & 0x800) == 0)
         ) {
        return 0;
      }
    }
    pKey_local._4_4_ = 1;
  }
  else {
    pKey_local._4_4_ = 0;
  }
  return pKey_local._4_4_;
}

Assistant:

static int HashmapIsIntKey(SyBlob *pKey)
{
	const char *zIn  = (const char *)SyBlobData(pKey);
	const char *zEnd = &zIn[SyBlobLength(pKey)];
	if( (int)(zEnd-zIn) > 1 && zIn[0] == '0' ){
		/* Octal not decimal number */
		return FALSE;
	}
	if( (zIn[0] == '-' || zIn[0] == '+') && &zIn[1] < zEnd ){
		zIn++;
	}
	for(;;){
		if( zIn >= zEnd ){
			return TRUE;
		}
		if( (unsigned char)zIn[0] >= 0xc0 /* UTF-8 stream */  || !SyisDigit(zIn[0]) ){
			break;
		}
		zIn++;
	}
	/* Key does not look like a decimal number */
	return FALSE;
}